

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::JsonReporter::testCasePartialEnded
          (JsonReporter *this,TestCaseStats *tcStats,uint64_t param_2)

{
  _Elt_pointer pJVar1;
  JsonObjectWriter JStack_1e8;
  JsonObjectWriter totals;
  JsonValueWriter local_1b8;
  
  endArray(this);
  if ((tcStats->stdOut)._M_string_length != 0) {
    pJVar1 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pJVar1 == (this->m_objectWriters).c.
                  super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pJVar1 = (this->m_objectWriters).c.
               super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    JsonObjectWriter::write
              ((JsonObjectWriter *)&local_1b8,(int)pJVar1 + -0x18,"captured-stdout",0xf);
    JsonValueWriter::write<std::__cxx11::string>(&local_1b8,&tcStats->stdOut);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8.m_sstream);
  }
  if ((tcStats->stdErr)._M_string_length != 0) {
    pJVar1 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pJVar1 == (this->m_objectWriters).c.
                  super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pJVar1 = (this->m_objectWriters).c.
               super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    JsonObjectWriter::write
              ((JsonObjectWriter *)&local_1b8,(int)pJVar1 + -0x18,"captured-stderr",0xf);
    JsonValueWriter::write<std::__cxx11::string>(&local_1b8,&tcStats->stdErr);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8.m_sstream);
  }
  pJVar1 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar1 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar1 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)&local_1b8,(int)pJVar1 + -0x18,"totals",6);
  JsonValueWriter::writeObject(&totals,&local_1b8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8.m_sstream);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1b8,(int)&totals,"assertions",10);
  JsonValueWriter::writeObject(&JStack_1e8,&local_1b8);
  writeCounts(&JStack_1e8,&(tcStats->totals).assertions);
  JsonObjectWriter::~JsonObjectWriter(&JStack_1e8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8.m_sstream);
  JsonObjectWriter::~JsonObjectWriter(&totals);
  endObject(this);
  return;
}

Assistant:

void JsonReporter::testCasePartialEnded( TestCaseStats const& tcStats,
                                             uint64_t /*index*/ ) {
        // Fixme: the top level section handles this.
        //// path object
        endArray();
        if ( !tcStats.stdOut.empty() ) {
            m_objectWriters.top()
                .write( "captured-stdout"_sr )
                .write( tcStats.stdOut );
        }
        if ( !tcStats.stdErr.empty() ) {
            m_objectWriters.top()
                .write( "captured-stderr"_sr )
                .write( tcStats.stdErr );
        }
        {
            auto totals =
                m_objectWriters.top().write( "totals"_sr ).writeObject();
            writeCounts( totals.write( "assertions"_sr ).writeObject(),
                         tcStats.totals.assertions );
            // We do not write the test case totals, because there will
            // always be just one test case here.
            // TODO: overall "result" -> success, skip, fail here? Or in
            // partial result?
        }
        // TODO: aborting?
        // run object
        endObject();
    }